

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_thread.c
# Opt level: O1

nhr_thread nhr_thread_create(nhr_thread_funct thread_function,void *user_object)

{
  int iVar1;
  nhr_mutex pvVar2;
  nhr_thread __arg;
  pthread_attr_t attr;
  pthread_attr_t pStack_58;
  
  if (thread_function == (nhr_thread_funct)0x0) {
    return (nhr_thread)0x0;
  }
  if (_threads_joiner == (_nhr_threads_joiner *)0x0) {
    _threads_joiner = (_nhr_threads_joiner *)nhr_malloc_zero(0x10);
    pvVar2 = nhr_mutex_create_recursive();
    _threads_joiner->mutex = pvVar2;
  }
  __arg = (nhr_thread)nhr_malloc_zero(0x18);
  __arg->user_object = user_object;
  __arg->thread_function = thread_function;
  iVar1 = pthread_attr_init(&pStack_58);
  if (iVar1 == 0) {
    iVar1 = pthread_attr_setscope(&pStack_58,0);
    if ((iVar1 == 0) && (iVar1 = pthread_attr_setdetachstate(&pStack_58,0), iVar1 == 0)) {
      iVar1 = pthread_create(&__arg->thread,&pStack_58,nhr_thread_func_priv,__arg);
      pthread_attr_destroy(&pStack_58);
      if (iVar1 == 0) {
        return __arg;
      }
    }
    else {
      pthread_attr_destroy(&pStack_58);
    }
  }
  __assert_fail("res == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/src/nhr_thread.c"
                ,0x92,"nhr_thread nhr_thread_create(nhr_thread_funct, void *)");
}

Assistant:

nhr_thread nhr_thread_create(nhr_thread_funct thread_function, void * user_object) {
	nhr_thread t = NULL;
	int res = -1;
#if !defined(NHR_OS_WINDOWS)
	pthread_attr_t attr;
#endif

	if (!thread_function) {
		return NULL;
	}
	nhr_threads_joiner_create_ifneed();
	t = (nhr_thread)nhr_malloc_zero(sizeof(struct nhr_thread_struct));
	t->user_object = user_object;
	t->thread_function = thread_function;
#if defined(NHR_OS_WINDOWS)
	t->thread = CreateThread(NULL, 0, &nhr_thread_func_priv, (LPVOID)t, 0, NULL);
	assert(t->thread);
#else
	if (pthread_attr_init(&attr) == 0) {
		if (pthread_attr_setscope(&attr, PTHREAD_SCOPE_SYSTEM) == 0) {
			if (pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE) == 0) {
				res = pthread_create(&t->thread, &attr, &nhr_thread_func_priv, (void *)t);
			}
		}
		pthread_attr_destroy(&attr);
	}
	assert(res == 0);
#endif
	return t;
}